

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O1

void GD::save_load_regressor<sparse_parameters>
               (vw *all,io_buf *model_file,bool read,bool text,sparse_parameters *weights)

{
  float fVar1;
  uint32_t uVar2;
  weight *pwVar3;
  ostream *poVar4;
  _Rb_tree_node_base *p_Var5;
  size_t sVar6;
  size_t sVar7;
  vw_exception *this;
  ulong *data;
  _Hash_node_base *p_Var8;
  uint32_t old_i;
  uint64_t i;
  stringstream msg;
  undefined1 local_1ec [4];
  ulong local_1e8;
  vw *local_1e0;
  string local_1d8;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  if (all->print_invert == true) {
    std::__cxx11::stringstream::stringstream(local_1b8);
    for (p_Var5 = (all->name_index_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var5 != &(all->name_index_map)._M_t._M_impl.super__Rb_tree_header;
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
      pwVar3 = sparse_parameters::operator[]
                         (weights,*(long *)(p_Var5 + 2) << ((byte)weights->_stride_shift & 0x3f));
      if ((*pwVar3 != 0.0) || (NAN(*pwVar3))) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,*(char **)(p_Var5 + 1),(long)p_Var5[1]._M_parent);
        bin_text_write_fixed(model_file,*(char **)(p_Var5 + 1),1,(stringstream *)local_1b8,true);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,":",1);
        poVar4 = std::ostream::_M_insert<double>((double)*pwVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
        bin_text_write_fixed(model_file,(char *)pwVar3,4,(stringstream *)local_1b8,true);
      }
    }
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  }
  else {
    local_1e8 = 0;
    local_1ec = (undefined1  [4])0x0;
    uVar2 = all->num_bits;
    local_1e0 = all;
    if (read) {
      do {
        if (local_1e0->num_bits < 0x1f) {
          sVar6 = io_buf::bin_read_fixed(model_file,local_1ec,4,"");
          local_1e8 = (ulong)(uint)local_1ec;
        }
        else {
          sVar6 = io_buf::bin_read_fixed(model_file,(char *)&local_1e8,8,"");
        }
        if (sVar6 == 0) {
          return;
        }
        if ((ulong)(1L << ((byte)uVar2 & 0x3f)) <= local_1e8) {
          std::__cxx11::stringstream::stringstream(local_1b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Model content is corrupted, weight vector index ",0x30);
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4," must be less than total vector length ",0x27);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          this = (vw_exception *)__cxa_allocate_exception(0x38);
          std::__cxx11::stringbuf::str();
          VW::vw_exception::vw_exception
                    (this,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/gd.cc"
                     ,0x2da,&local_1d8);
          __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
        }
        pwVar3 = sparse_parameters::operator[]
                           (weights,local_1e8 << ((byte)weights->_stride_shift & 0x3f));
        sVar7 = io_buf::bin_read_fixed(model_file,(char *)pwVar3,4,"");
      } while (sVar6 + sVar7 != 0);
    }
    else {
      p_Var8 = (weights->_map)._M_h._M_before_begin._M_nxt;
      if (p_Var8 != (_Hash_node_base *)0x0) {
        do {
          fVar1 = *(float *)&(p_Var8[2]._M_nxt)->_M_nxt;
          if ((fVar1 != 0.0) || (NAN(fVar1))) {
            local_1e8 = (ulong)p_Var8[1]._M_nxt >> ((byte)weights->_stride_shift & 0x3f);
            std::__cxx11::stringstream::stringstream(local_1b8);
            std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
            sVar6 = 8;
            data = &local_1e8;
            if (local_1e0->num_bits < 0x1f) {
              local_1ec = (undefined1  [4])(uint)local_1e8;
              sVar6 = 4;
              data = (ulong *)local_1ec;
            }
            bin_text_write_fixed(model_file,(char *)data,sVar6,(stringstream *)local_1b8,text);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
            poVar4 = std::ostream::_M_insert<double>((double)*(float *)&(p_Var8[2]._M_nxt)->_M_nxt);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
            bin_text_write_fixed
                      (model_file,(char *)p_Var8[2]._M_nxt,4,(stringstream *)local_1b8,text);
            std::__cxx11::stringstream::~stringstream(local_1b8);
            std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
          }
          p_Var8 = p_Var8->_M_nxt;
        } while (p_Var8 != (_Hash_node_base *)0x0);
      }
    }
  }
  return;
}

Assistant:

void save_load_regressor(vw& all, io_buf& model_file, bool read, bool text, T& weights)
{
  size_t brw = 1;

  if (all.print_invert)  // write readable model with feature names
  {
    stringstream msg;
    typedef std::map<std::string, size_t> str_int_map;

    for (str_int_map::iterator it = all.name_index_map.begin(); it != all.name_index_map.end(); ++it)
    {
      weight* v = &weights.strided_index(it->second);
      if (*v != 0.)
      {
        msg << it->first;
        brw = bin_text_write_fixed(model_file, (char*)it->first.c_str(), sizeof(*it->first.c_str()), msg, true);

        msg << ":" << it->second << ":" << *v << "\n";
        bin_text_write_fixed(model_file, (char*)&(*v), sizeof(*v), msg, true);
      }
    }
    return;
  }

  uint64_t i = 0;
  uint32_t old_i = 0;
  uint64_t length = (uint64_t)1 << all.num_bits;
  if (read)
    do
    {
      brw = 1;
      if (all.num_bits < 31)  // backwards compatible
      {
        brw = model_file.bin_read_fixed((char*)&old_i, sizeof(old_i), "");
        i = old_i;
      }
      else
        brw = model_file.bin_read_fixed((char*)&i, sizeof(i), "");
      if (brw > 0)
      {
        if (i >= length)
          THROW("Model content is corrupted, weight vector index " << i << " must be less than total vector length "
                                                                   << length);
        weight* v = &weights.strided_index(i);
        brw += model_file.bin_read_fixed((char*)&(*v), sizeof(*v), "");
      }
    } while (brw > 0);
  else  // write
    for (typename T::iterator v = weights.begin(); v != weights.end(); ++v)
      if (*v != 0.)
      {
        i = v.index() >> weights.stride_shift();
        stringstream msg;
        msg << i;

        if (all.num_bits < 31)
        {
          old_i = (uint32_t)i;
          brw = bin_text_write_fixed(model_file, (char*)&old_i, sizeof(old_i), msg, text);
        }
        else
          brw = bin_text_write_fixed(model_file, (char*)&i, sizeof(i), msg, text);

        msg << ":" << *v << "\n";
        brw += bin_text_write_fixed(model_file, (char*)&(*v), sizeof(*v), msg, text);
      }
}